

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_load_balancers.cc
# Opt level: O1

int __thiscall
aliyun::Slb::DescribeLoadBalancers
          (Slb *this,SlbDescribeLoadBalancersRequestType *req,
          SlbDescribeLoadBalancersResponseType *response,SlbErrorInfo *error_info)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ArrayIndex AVar4;
  char *pcVar5;
  AliRpcRequest *this_00;
  long *plVar6;
  size_t sVar7;
  Value *pVVar8;
  Value *pVVar9;
  size_type *psVar10;
  uint index;
  Value val;
  string secheme;
  string str_response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Reader reader;
  string local_878;
  Value local_858;
  vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
  *local_840;
  long *local_838;
  long local_830;
  long local_828 [2];
  string local_818;
  Value *local_7f8;
  string local_7f0;
  undefined1 local_7d0 [32];
  _Alloc_hider local_7b0;
  size_type local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  _Alloc_hider local_790;
  size_type local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  _Alloc_hider local_770;
  size_type local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  _Alloc_hider local_750;
  size_type local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  _Alloc_hider local_730;
  size_type local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_710;
  size_type local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  _Alloc_hider local_6f0;
  size_type local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0;
  _Alloc_hider local_6d0;
  size_type local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0;
  _Alloc_hider local_6b0;
  size_type local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  _Alloc_hider local_690;
  size_type local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  _Alloc_hider local_670;
  size_type local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  Int local_650;
  _Alloc_hider local_648;
  size_type local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  _Alloc_hider local_628;
  size_type local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  Int local_608;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  local_818._M_string_length = 0;
  local_818.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar5 = "https";
  }
  local_838 = local_828;
  local_840 = &response->load_balancers;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,pcVar5,pcVar5 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_858);
  local_7d0._0_8_ = local_7d0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_7d0,local_838,local_830 + (long)local_838);
  std::__cxx11::string::append(local_7d0);
  plVar6 = (long *)std::__cxx11::string::append(local_7d0);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_7f0.field_2._M_allocated_capacity = *psVar10;
    local_7f0.field_2._8_8_ = plVar6[3];
    local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  }
  else {
    local_7f0.field_2._M_allocated_capacity = *psVar10;
    local_7f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_7f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_7f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
    operator_delete((void *)local_7d0._0_8_,CONCAT71(local_7d0._17_7_,local_7d0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar7 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar5,pcVar5 + sVar7);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_858,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeLoadBalancers","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar1 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar1,pcVar1 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar1 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar1 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar1,pcVar1 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->server_id)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ServerId","");
    pcVar1 = (req->server_id)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar1,pcVar1 + (req->server_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"LoadBalancerId","");
    pcVar1 = (req->load_balancer_id)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar1,pcVar1 + (req->load_balancer_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->address_type)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"AddressType","");
    pcVar1 = (req->address_type)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar1,pcVar1 + (req->address_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->internet_charge_type)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"InternetChargeType","");
    pcVar1 = (req->internet_charge_type)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar1,pcVar1 + (req->internet_charge_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->vpc_id)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"VpcId","");
    pcVar1 = (req->vpc_id)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar1,pcVar1 + (req->vpc_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->vswitch_id)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"VSwitchId","");
    pcVar1 = (req->vswitch_id)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar1,pcVar1 + (req->vswitch_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->network_type)._M_string_length != 0) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"NetworkType","");
    pcVar1 = (req->network_type)._M_dataplus._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar1,pcVar1 + (req->network_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->address)._M_string_length != 0) {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"Address","");
    pcVar1 = (req->address)._M_dataplus._M_p;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,pcVar1,pcVar1 + (req->address)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->security_status)._M_string_length != 0) {
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"SecurityStatus","");
    pcVar1 = (req->security_status)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar1,pcVar1 + (req->security_status)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->master_zone_id)._M_string_length != 0) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"MasterZoneId","");
    pcVar1 = (req->master_zone_id)._M_dataplus._M_p;
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,pcVar1,pcVar1 + (req->master_zone_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->slave_zone_id)._M_string_length != 0) {
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"SlaveZoneId","");
    pcVar1 = (req->slave_zone_id)._M_dataplus._M_p;
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0,pcVar1,pcVar1 + (req->slave_zone_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"OwnerAccount","");
    pcVar1 = (req->owner_account)._M_dataplus._M_p;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,pcVar1,pcVar1 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_7d0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar3 == 0) {
    iVar3 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_818);
    if (((0 < iVar3) && (local_818._M_string_length != 0)) &&
       (bVar2 = Json::Reader::parse(&local_140,&local_818,&local_858,true), bVar2)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar3 != 200) {
        bVar2 = Json::Value::isMember(&local_858,"RequestId");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_858,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_7d0,pVVar8);
        }
        else {
          local_7d0._0_8_ = local_7d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7d0,anon_var_dwarf_27d9af + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_7d0);
        if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
          operator_delete((void *)local_7d0._0_8_,CONCAT71(local_7d0._17_7_,local_7d0[0x10]) + 1);
        }
        bVar2 = Json::Value::isMember(&local_858,"Code");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_858,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_7d0,pVVar8);
        }
        else {
          local_7d0._0_8_ = local_7d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7d0,anon_var_dwarf_27d9af + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_7d0);
        if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
          operator_delete((void *)local_7d0._0_8_,CONCAT71(local_7d0._17_7_,local_7d0[0x10]) + 1);
        }
        bVar2 = Json::Value::isMember(&local_858,"HostId");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_858,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_7d0,pVVar8);
        }
        else {
          local_7d0._0_8_ = local_7d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7d0,anon_var_dwarf_27d9af + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_7d0);
        if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
          operator_delete((void *)local_7d0._0_8_,CONCAT71(local_7d0._17_7_,local_7d0[0x10]) + 1);
        }
        bVar2 = Json::Value::isMember(&local_858,"Message");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_858,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_7d0,pVVar8);
        }
        else {
          local_7d0._0_8_ = local_7d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_7d0,anon_var_dwarf_27d9af + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_7d0);
        if ((undefined1 *)local_7d0._0_8_ != local_7d0 + 0x10) {
          operator_delete((void *)local_7d0._0_8_,CONCAT71(local_7d0._17_7_,local_7d0[0x10]) + 1);
        }
      }
      if ((local_840 !=
           (vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
            *)0x0 && iVar3 == 200) &&
         (bVar2 = Json::Value::isMember(&local_858,"LoadBalancers"), bVar2)) {
        pVVar8 = Json::Value::operator[](&local_858,"LoadBalancers");
        bVar2 = Json::Value::isMember(pVVar8,"LoadBalancer");
        if (bVar2) {
          pVVar8 = Json::Value::operator[](&local_858,"LoadBalancers");
          pVVar8 = Json::Value::operator[](pVVar8,"LoadBalancer");
          bVar2 = Json::Value::isArray(pVVar8);
          if ((bVar2) && (AVar4 = Json::Value::size(pVVar8), AVar4 != 0)) {
            index = 0;
            local_7f8 = pVVar8;
            do {
              local_7d0._0_8_ = local_7d0 + 0x10;
              local_7d0._8_8_ = 0;
              local_7d0[0x10] = '\0';
              local_7b0._M_p = (pointer)&local_7a0;
              local_7a8 = 0;
              local_7a0._M_local_buf[0] = '\0';
              local_790._M_p = (pointer)&local_780;
              local_788 = 0;
              local_780._M_local_buf[0] = '\0';
              local_770._M_p = (pointer)&local_760;
              local_768 = 0;
              local_760._M_local_buf[0] = '\0';
              local_750._M_p = (pointer)&local_740;
              local_748 = 0;
              local_740._M_local_buf[0] = '\0';
              local_730._M_p = (pointer)&local_720;
              local_728 = 0;
              local_720._M_local_buf[0] = '\0';
              local_710._M_p = (pointer)&local_700;
              local_708 = 0;
              local_700._M_local_buf[0] = '\0';
              local_6f0._M_p = (pointer)&local_6e0;
              local_6e8 = 0;
              local_6e0._M_local_buf[0] = '\0';
              local_6d0._M_p = (pointer)&local_6c0;
              local_6c8 = 0;
              local_6c0._M_local_buf[0] = '\0';
              local_6b0._M_p = (pointer)&local_6a0;
              local_6a8 = 0;
              local_6a0._M_local_buf[0] = '\0';
              local_690._M_p = (pointer)&local_680;
              local_688 = 0;
              local_680._M_local_buf[0] = '\0';
              local_670._M_p = (pointer)&local_660;
              local_668 = 0;
              local_660._M_local_buf[0] = '\0';
              local_648._M_p = (pointer)&local_638;
              local_640 = 0;
              local_638._M_local_buf[0] = '\0';
              local_628._M_p = (pointer)&local_618;
              local_620 = 0;
              local_618._M_local_buf[0] = '\0';
              pVVar8 = Json::Value::operator[](pVVar8,index);
              bVar2 = Json::Value::isMember(pVVar8,"LoadBalancerId");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"LoadBalancerId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)local_7d0,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"LoadBalancerName");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"LoadBalancerName");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_7b0,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"LoadBalancerStatus");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"LoadBalancerStatus");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_790,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"Address");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"Address");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_770,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"AddressType");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"AddressType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_750,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"RegionId");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"RegionId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_730,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"RegionIdAlias");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"RegionIdAlias");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_710,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"VSwitchId");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"VSwitchId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_6f0,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"VpcId");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"VpcId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_6d0,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"NetworkType");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"NetworkType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_6b0,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"MasterZoneId");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"MasterZoneId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_690,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"SlaveZoneId");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"SlaveZoneId");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_670,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"MaxConnLimit");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"MaxConnLimit");
                local_650 = Json::Value::asInt(pVVar9);
              }
              bVar2 = Json::Value::isMember(pVVar8,"SecurityStatus");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"SecurityStatus");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_648,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"InternetChargeType");
              if (bVar2) {
                pVVar9 = Json::Value::operator[](pVVar8,"InternetChargeType");
                Json::Value::asString_abi_cxx11_(&local_878,pVVar9);
                std::__cxx11::string::operator=((string *)&local_628,(string *)&local_878);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_878._M_dataplus._M_p != &local_878.field_2) {
                  operator_delete(local_878._M_dataplus._M_p,
                                  local_878.field_2._M_allocated_capacity + 1);
                }
              }
              bVar2 = Json::Value::isMember(pVVar8,"SysBandwidth");
              if (bVar2) {
                pVVar8 = Json::Value::operator[](pVVar8,"SysBandwidth");
                local_608 = Json::Value::asInt(pVVar8);
              }
              std::
              vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
              ::push_back(local_840,(value_type *)local_7d0);
              SlbDescribeLoadBalancersLoadBalancerType::~SlbDescribeLoadBalancersLoadBalancerType
                        ((SlbDescribeLoadBalancersLoadBalancerType *)local_7d0);
              pVVar8 = local_7f8;
              AVar4 = Json::Value::size(local_7f8);
              index = index + 1;
            } while (index < AVar4);
          }
        }
      }
      goto LAB_00143056;
    }
    if (error_info == (SlbErrorInfo *)0x0) goto LAB_00143051;
    pcVar5 = "parse response failed";
  }
  else {
    if (error_info == (SlbErrorInfo *)0x0) {
LAB_00143051:
      iVar3 = -1;
      goto LAB_00143056;
    }
    pcVar5 = "connect to host failed";
  }
  iVar3 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar5);
LAB_00143056:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_858);
  if (local_838 != local_828) {
    operator_delete(local_838,local_828[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,
                    CONCAT71(local_818.field_2._M_allocated_capacity._1_7_,
                             local_818.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int Slb::DescribeLoadBalancers(const SlbDescribeLoadBalancersRequestType& req,
                      SlbDescribeLoadBalancersResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeLoadBalancers");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.server_id.empty()) {
    req_rpc->AddRequestQuery("ServerId", req.server_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.address_type.empty()) {
    req_rpc->AddRequestQuery("AddressType", req.address_type);
  }
  if(!req.internet_charge_type.empty()) {
    req_rpc->AddRequestQuery("InternetChargeType", req.internet_charge_type);
  }
  if(!req.vpc_id.empty()) {
    req_rpc->AddRequestQuery("VpcId", req.vpc_id);
  }
  if(!req.vswitch_id.empty()) {
    req_rpc->AddRequestQuery("VSwitchId", req.vswitch_id);
  }
  if(!req.network_type.empty()) {
    req_rpc->AddRequestQuery("NetworkType", req.network_type);
  }
  if(!req.address.empty()) {
    req_rpc->AddRequestQuery("Address", req.address);
  }
  if(!req.security_status.empty()) {
    req_rpc->AddRequestQuery("SecurityStatus", req.security_status);
  }
  if(!req.master_zone_id.empty()) {
    req_rpc->AddRequestQuery("MasterZoneId", req.master_zone_id);
  }
  if(!req.slave_zone_id.empty()) {
    req_rpc->AddRequestQuery("SlaveZoneId", req.slave_zone_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}